

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandFunEnum(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  Gia_Man_t **local_e8;
  Gia_Man_t *pTemp;
  char Buffer [100];
  int fVerbose;
  int fDump;
  int fMulti;
  int fDelay;
  int fSimple;
  int fReduce;
  int fUseTwo;
  int nNodeMax;
  int nVars;
  int nInputs;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nNodeMax = 4;
  fUseTwo = 4;
  fReduce = 0x20;
  fSimple = 0;
  fDelay = 0;
  bVar1 = false;
  fDump = 0;
  fVerbose = 0;
  Buffer[0x60] = '\0';
  Buffer[0x61] = '\0';
  Buffer[0x62] = '\0';
  Buffer[99] = '\0';
  Buffer[0x5c] = '\0';
  Buffer[0x5d] = '\0';
  Buffer[0x5e] = '\0';
  Buffer[0x5f] = '\0';
  Extra_UtilGetoptReset();
LAB_0028cb53:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"SIMtrldmpvh");
    if (iVar2 == -1) {
      if ((bVar1) || (fDump != 0)) {
        if ((fUseTwo < 3) || (5 < fUseTwo)) {
          Abc_Print(-1,"The number of inputs should be 3 <= I <= 5.\n");
          goto LAB_0028ceb0;
        }
        sprintf((char *)&pTemp,"Lflib%d.txt",(ulong)(uint)fUseTwo);
        if (Buffer._96_4_ == 0) {
          local_e8 = (Gia_Man_t **)0x0;
        }
        else {
          local_e8 = &pTemp;
        }
        Dtt_EnumerateLf(fUseTwo,fReduce,fDump,fVerbose,Buffer._92_4_,(char *)local_e8);
        if (Buffer._96_4_ != 0) {
          pNew = Dau_ConstructAigFromFile((char *)&pTemp);
          Abc_FrameUpdateGia(pAbc,pNew);
          Gia_DumpAiger(pNew,"Lflib",fUseTwo,1);
        }
      }
      else {
        if ((fUseTwo < 2) || (6 < fUseTwo)) {
          Abc_Print(-1,"The number of inputs should be 2 <= I <= 6.\n");
          goto LAB_0028ceb0;
        }
        if ((nNodeMax < fUseTwo) || (6 < nNodeMax)) {
          Abc_Print(-1,"The intermediate support size should be I <= S <= 6.\n");
          goto LAB_0028ceb0;
        }
        Dau_FunctionEnum(nNodeMax,fUseTwo,fReduce,fSimple,fDelay,Buffer._92_4_);
      }
      return 0;
    }
    switch(iVar2) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_0028ceb0;
      }
      fUseTwo = atoi(argv[globalUtilOptind]);
      iVar2 = fUseTwo;
      break;
    default:
      Abc_Print(-2,"Unknown switch.\n");
      goto LAB_0028ceb0;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_0028ceb0;
      }
      fReduce = atoi(argv[globalUtilOptind]);
      iVar2 = fReduce;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_0028ceb0;
      }
      nNodeMax = atoi(argv[globalUtilOptind]);
      iVar2 = nNodeMax;
      break;
    case 100:
      fDump = fDump ^ 1;
      goto LAB_0028cb53;
    case 0x68:
      goto LAB_0028ceb0;
    case 0x6c:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0028cb53;
    case 0x6d:
      fVerbose = fVerbose ^ 1;
      goto LAB_0028cb53;
    case 0x70:
      Buffer._96_4_ = Buffer._96_4_ ^ 1;
      goto LAB_0028cb53;
    case 0x72:
      fDelay = fDelay ^ 1;
      goto LAB_0028cb53;
    case 0x74:
      fSimple = fSimple ^ 1;
      goto LAB_0028cb53;
    case 0x76:
      Buffer._92_4_ = Buffer._92_4_ ^ 1;
      goto LAB_0028cb53;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_0028ceb0:
      Abc_Print(-2,"usage: funenum [-SIM num] [-trldmvph]\n");
      Abc_Print(-2,"\t         enumerates minimum 2-input-gate implementations\n");
      Abc_Print(-2,"\t-S num : the maximum intermediate support size [default = %d]\n",
                (ulong)(uint)nNodeMax);
      Abc_Print(-2,"\t-I num : the number of inputs of Boolean functions [default = %d]\n",
                (ulong)(uint)fUseTwo);
      Abc_Print(-2,"\t-M num : the maximum number of 2-input gates [default = %d]\n",
                (ulong)(uint)fReduce);
      pcVar3 = "no";
      if (fSimple != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle adding combination of two gates [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (fDelay != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r     : toggle reducing the last level [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (bVar1) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-l     : toggle generating L(f) rather than C(f) [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (fDump != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle generating D(f) rather than C(f) [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (fVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggle generating multiplicity statistics [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Buffer._92_4_ != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Buffer._96_4_ != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-p     : toggle dumping result library (formula and AIG) [default = %s]\n",
                pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandFunEnum( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Dtt_EnumerateLf( int nVars, int nNodeMax, int fDelay, int fMulti, int fVerbose, char* pFileName );
    extern void Dau_FunctionEnum( int nInputs, int nVars, int nNodeMax, int fUseTwo, int fReduce, int fVerbose );
    extern Gia_Man_t * Dau_ConstructAigFromFile( char * pFileName );
    int c, nInputs = 4, nVars = 4, nNodeMax = 32, fUseTwo = 0, fReduce = 0, fSimple = 0, fDelay = 0, fMulti = 0, fDump = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SIMtrldmpvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nInputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInputs < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVars < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodeMax < 0 )
                goto usage;
            break;
        case 't':
            fUseTwo ^= 1;
            break;
        case 'r':
            fReduce ^= 1;
            break;
        case 'l':
            fSimple ^= 1;
            break;
        case 'd':
            fDelay ^= 1;
            break;
        case 'm':
            fMulti ^= 1;
            break;
        case 'p':
            fDump ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    if ( fSimple || fDelay )
    {
        char Buffer[100];
        if ( nVars < 3 || nVars > 5 )
        {
            Abc_Print( -1, "The number of inputs should be 3 <= I <= 5.\n" );
            goto usage;
        }
        sprintf( Buffer, "Lflib%d.txt", nVars );
        Dtt_EnumerateLf( nVars, nNodeMax, fDelay, fMulti, fVerbose, fDump?Buffer:NULL );
        if ( fDump )
        {
            Gia_Man_t * pTemp;
            pTemp = Dau_ConstructAigFromFile( Buffer );
            Abc_FrameUpdateGia( pAbc, pTemp );
            Gia_DumpAiger( pTemp, "Lflib", nVars, 1 );
        }
    }
    else
    {
        if ( nVars < 2 || nVars > 6 )
        {
            Abc_Print( -1, "The number of inputs should be 2 <= I <= 6.\n" );
            goto usage;
        }
        if ( nInputs < nVars || nInputs > 6 )
        {
            Abc_Print( -1, "The intermediate support size should be I <= S <= 6.\n" );
            goto usage;
        }
        Dau_FunctionEnum( nInputs, nVars, nNodeMax, fUseTwo, fReduce, fVerbose );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: funenum [-SIM num] [-trldmvph]\n" );
    Abc_Print( -2, "\t         enumerates minimum 2-input-gate implementations\n" );
    Abc_Print( -2, "\t-S num : the maximum intermediate support size [default = %d]\n",     nInputs );
    Abc_Print( -2, "\t-I num : the number of inputs of Boolean functions [default = %d]\n", nVars );
    Abc_Print( -2, "\t-M num : the maximum number of 2-input gates [default = %d]\n",       nNodeMax );
    Abc_Print( -2, "\t-t     : toggle adding combination of two gates [default = %s]\n",    fUseTwo?  "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle reducing the last level [default = %s]\n",            fReduce?  "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle generating L(f) rather than C(f) [default = %s]\n",   fSimple?  "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle generating D(f) rather than C(f) [default = %s]\n",   fDelay?   "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle generating multiplicity statistics [default = %s]\n", fMulti?   "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n",                     fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle dumping result library (formula and AIG) [default = %s]\n",fDump?"yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}